

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.cpp
# Opt level: O0

double __thiscall smf::MidiEvent::getDurationInSeconds(MidiEvent *this)

{
  double dVar1;
  MidiEvent *pMVar2;
  double seconds2;
  MidiEvent *mev;
  MidiEvent *this_local;
  
  pMVar2 = getLinkedEvent(this);
  if (pMVar2 == (MidiEvent *)0x0) {
    this_local = (MidiEvent *)0x0;
  }
  else {
    dVar1 = pMVar2->seconds;
    if (dVar1 < this->seconds || dVar1 == this->seconds) {
      this_local = (MidiEvent *)(this->seconds - dVar1);
    }
    else {
      this_local = (MidiEvent *)(dVar1 - this->seconds);
    }
  }
  return (double)this_local;
}

Assistant:

double MidiEvent::getDurationInSeconds(void) const {
	const MidiEvent* mev = getLinkedEvent();
	if (mev == NULL) {
		return 0;
	}
	double seconds2 = mev->seconds;
	if (seconds2 > seconds) {
		return seconds2 - seconds;
	} else {
		return seconds - seconds2;
	}
}